

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas3.cxx
# Opt level: O0

void HBLAS3::
     hblas3_gemm<HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,HAXX::quaternion<double>,(char)67,(char)84,100ul,100ul,100ul>
               (void)

{
  complex<double> ALPHA_00;
  complex<double> ALPHA_01;
  quaternion<double> BETA_00;
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  reference pvVar4;
  reference A_00;
  type __y;
  quaternion<double> *Y;
  undefined8 in_XMM0_Qa;
  rep_conflict rVar5;
  undefined8 in_XMM1_Qa;
  value_type tstVal;
  quaternion<double> refVal;
  size_t indx;
  size_t i;
  int32_t BStart;
  size_t j;
  int32_t BStride;
  duration<double,_std::ratio<1L,_1L>_> gemmDur;
  time_point gemmEnd;
  time_point gemmStart;
  string BetaFstr;
  string AlphaFstr;
  string BFstr;
  string AFstr;
  quaternion<double> BETA;
  complex<double> ALPHA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> SCR;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> CC;
  quaternion<double> *x_2;
  iterator __end2;
  iterator __begin2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_2;
  quaternion<double> *x_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_1;
  quaternion<double> *x;
  iterator __end0;
  iterator __begin0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> C;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> B;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  size_t LDC;
  size_t LDB;
  size_t LDA;
  size_t NM;
  size_t KM;
  size_t NK;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff948;
  undefined4 uVar6;
  undefined1 pv_;
  quaternion<double> *__y_00;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  *in_stack_fffffffffffff950;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffff95c;
  allocator_type *in_stack_fffffffffffff960;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *this;
  size_type in_stack_fffffffffffff968;
  double BETA_01;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff970;
  quaternion<double> *X;
  undefined8 uVar8;
  int32_t in_stack_fffffffffffff98c;
  undefined8 in_stack_fffffffffffff990;
  reference in_stack_fffffffffffff998;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff9a0;
  quaternion<double> *__q;
  int32_t iVar9;
  undefined8 in_stack_fffffffffffff9d0;
  quaternion<double> *in_stack_fffffffffffff9d8;
  int32_t LDB_00;
  undefined8 in_stack_fffffffffffff9e0;
  quaternion<double> *__x;
  undefined4 in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffffa00;
  undefined4 uVar10;
  int32_t LDC_00;
  basic_cstring<const_char> local_4e8 [15];
  undefined1 local_3f8 [32];
  undefined8 local_3d8;
  undefined1 local_370 [24];
  undefined1 local_358 [16];
  basic_cstring<const_char> local_348;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  size_type local_2d8;
  ulong local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  int local_2b4;
  ulong local_2b0;
  undefined4 local_2a4;
  rep local_2a0;
  duration<double,_std::ratio<1L,_1L>_> local_298;
  undefined8 local_290;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_288;
  double dStack_280;
  quaternion<double> *pqStack_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_250;
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_1c8;
  double dStack_1c0;
  quaternion<double> *pqStack_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_190;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_178;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  reference local_140;
  quaternion<double> *local_138;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_130;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  reference local_100;
  quaternion<double> *local_f8;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_f0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  reference local_c0;
  quaternion<double> *local_b8;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_b0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_a8;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_98;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_78 [2];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_48;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_8 = 10000;
  local_10 = 10000;
  local_18 = 10000;
  local_20 = 100;
  local_28 = 100;
  local_30 = 100;
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x27a754);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x27a780);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x27a7a5);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x27a7d1);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x27a7f6);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x27a822);
  local_a8 = &local_48;
  local_b0._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 (in_stack_fffffffffffff948);
  local_b8 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       (in_stack_fffffffffffff948);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffff950,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff948);
    if (!bVar1) break;
    local_c0 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_b0);
    genRandom<HAXX::quaternion<double>>();
    local_c0->_M_real = local_e0;
    local_c0->_M_imag_i = local_d8;
    local_c0->_M_imag_j = local_d0;
    local_c0->_M_imag_k = local_c8;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_b0);
  }
  local_e8 = local_78;
  local_f0._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 (in_stack_fffffffffffff948);
  local_f8 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       (in_stack_fffffffffffff948);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffff950,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff948);
    if (!bVar1) break;
    local_100 = __gnu_cxx::
                __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                ::operator*(&local_f0);
    genRandom<HAXX::quaternion<double>>();
    local_100->_M_real = local_120;
    local_100->_M_imag_i = local_118;
    local_100->_M_imag_j = local_110;
    local_100->_M_imag_k = local_108;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_f0);
  }
  local_128 = &local_98;
  local_130._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 (in_stack_fffffffffffff948);
  local_138 = (quaternion<double> *)
              std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                        (in_stack_fffffffffffff948);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffff950,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff948);
    LDB_00 = (int32_t)in_stack_fffffffffffff9e0;
    iVar9 = (int32_t)in_stack_fffffffffffff9d0;
    if (!bVar1) break;
    local_140 = __gnu_cxx::
                __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                ::operator*(&local_130);
    genRandom<HAXX::quaternion<double>>();
    local_140->_M_real = local_160;
    local_140->_M_imag_i = local_158;
    local_140->_M_imag_j = local_150;
    local_140->_M_imag_k = local_148;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_130);
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff9a0,
             (vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff998);
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffff948 >> 0x20);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x27ab22);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x27ab4b);
  genRandom<std::complex<double>>();
  local_1a8 = in_XMM0_Qa;
  uStack_1a0 = in_XMM1_Qa;
  genRandom<HAXX::quaternion<double>>();
  t_str<HAXX::quaternion<double>>();
  t_str<HAXX::quaternion<double>>();
  t_str<std::complex<double>>();
  t_str<HAXX::quaternion<double>>();
  std::operator<<((ostream *)&std::cout,"\n HBLAS GEMM TEST: \n");
  std::operator<<((ostream *)&std::cout,"   - _F =      DOUBLE    \n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _AF =     ");
  poVar2 = std::operator<<(poVar2,local_1e8);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _BF =     ");
  poVar2 = std::operator<<(poVar2,local_208);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _AlphaF = ");
  poVar2 = std::operator<<(poVar2,local_228);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _BetaF =  ");
  poVar2 = std::operator<<(poVar2,local_248);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _TA =     ");
  poVar2 = std::operator<<(poVar2,'C');
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _TB =     ");
  poVar2 = std::operator<<(poVar2,'T');
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)&std::cout,"\n   PROBLEM DIMENSIONS\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"     - N =     ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,100);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"     - M =     ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,100);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"     - K =     ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,100);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"     - LDA =   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"     - LDB =   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"     - LDC =   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
  std::operator<<(poVar2,"\n");
  LDC_00 = (int32_t)poVar2;
  std::operator<<((ostream *)&std::cout,"\n");
  local_250 = std::chrono::_V2::system_clock::now();
  local_268 = local_1a8;
  uStack_260 = uStack_1a0;
  __x = (quaternion<double> *)0x0;
  pvVar3 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](&local_48,0);
  uVar10 = (undefined4)local_20;
  pvVar4 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](local_78,(size_type)__x);
  local_288 = local_1c8;
  dStack_280 = dStack_1c0;
  pqStack_278 = pqStack_1b8;
  uStack_270 = uStack_1b0;
  uVar7 = (undefined4)local_28;
  A_00 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
         operator[](&local_98,(size_type)__x);
  __y_00 = (quaternion<double> *)CONCAT44(uVar6,uVar10);
  ALPHA_00._M_value._8_8_ = in_stack_fffffffffffff9a0;
  ALPHA_00._M_value._0_8_ = in_stack_fffffffffffff998;
  BETA_00._M_imag_i._0_4_ = in_stack_fffffffffffff9f0;
  BETA_00._M_real = (double)__x;
  BETA_00._M_imag_i._4_4_ = uVar7;
  BETA_00._M_imag_j = (double)pvVar4;
  BETA_00._M_imag_k._0_4_ = in_stack_fffffffffffffa00;
  BETA_00._M_imag_k._4_4_ = uVar10;
  this = local_288;
  BETA_01 = dStack_280;
  X = pqStack_278;
  uVar8 = uStack_270;
  HAXX::
  HBLAS_GEMM<double,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,HAXX::quaternion<double>>
            ((char)((ulong)in_stack_fffffffffffff990 >> 0x38),
             (char)((ulong)in_stack_fffffffffffff990 >> 0x30),(int32_t)in_stack_fffffffffffff990,
             in_stack_fffffffffffff98c,(int32_t)local_30,ALPHA_00,A_00,iVar9,
             in_stack_fffffffffffff9d8,LDB_00,BETA_00,pvVar3,LDC_00);
  local_290 = std::chrono::_V2::system_clock::now();
  __y = std::chrono::operator-
                  ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)CONCAT44(in_stack_fffffffffffff95c,uVar7),
                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)pvVar4);
  local_2a0 = __y.__r;
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)this,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)
             CONCAT44(in_stack_fffffffffffff95c,uVar7));
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2," * GEMM took ");
  rVar5 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_298);
  Y = (quaternion<double> *)std::ostream::operator<<(poVar2,rVar5);
  std::operator<<((ostream *)Y," s\n\n");
  local_2a4 = (undefined4)local_28;
  for (local_2b0 = 0; uVar7 = (undefined4)((ulong)__y_00 >> 0x20), local_2b0 < 100;
      local_2b0 = local_2b0 + 1) {
    local_2b4 = (int)local_2b0;
    local_2c8 = local_1a8;
    uStack_2c0 = uStack_1a0;
    __q = (quaternion<double> *)0x0;
    std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
              (&local_48,0);
    pvVar3 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
             operator[](local_78,(long)local_2b4);
    uVar10 = local_2a4;
    iVar9 = (int32_t)pvVar3;
    pvVar3 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
             operator[](&local_190,(size_type)__q);
    __y_00 = (quaternion<double> *)CONCAT44(uVar7,uVar10);
    uVar7 = 1;
    ALPHA_01._M_value._8_8_ = __q;
    ALPHA_01._M_value._0_8_ = in_stack_fffffffffffff998;
    HAXX::
    HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,double>
              ((char)((ulong)in_stack_fffffffffffff990 >> 0x38),(int32_t)in_stack_fffffffffffff990,
               in_stack_fffffffffffff98c,ALPHA_01,A_00,(int32_t)((ulong)uVar8 >> 0x20),X,iVar9,
               BETA_01,Y,(int32_t)poVar2);
    for (local_2d0 = 0; local_2d0 < 100; local_2d0 = local_2d0 + 1) {
      local_2d8 = local_2d0 + local_2b0 * local_30;
      in_stack_fffffffffffff998 =
           std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](&local_190,local_2d0);
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_178,local_2d8);
      HAXX::operator*(__x,(quaternion<double> *)__y.__r);
      HAXX::operator+(pvVar3,__y_00);
      pvVar4 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
               operator[](&local_98,local_2d8);
      local_338 = pvVar4->_M_real;
      local_330 = pvVar4->_M_imag_i;
      local_328 = pvVar4->_M_imag_j;
      local_320 = pvVar4->_M_imag_k;
      do {
        in_stack_fffffffffffff990 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_348,
                   "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx"
                   ,0x58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)pvVar3);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffff990,&local_348,0x88,local_358);
        HAXX::inv<double>(__q);
        HAXX::operator*(__x,(quaternion<double> *)__y.__r);
        local_3d8 = 0x3ff0000000000000;
        HAXX::operator-(pvVar3,&__y_00->_M_real);
        pv_ = (undefined1)((ulong)__y_00 >> 0x38);
        HAXX::norm<double>(X);
        boost::test_tools::assertion_result::assertion_result((assertion_result *)pvVar3,(bool)pv_);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff95c,uVar7),(char (*) [7])pvVar3);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]> *)
                   CONCAT44(in_stack_fffffffffffff95c,uVar7),(unsigned_long *)pvVar3);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>
                    *)CONCAT44(in_stack_fffffffffffff95c,uVar7),(char (*) [6])pvVar3);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>
                    *)CONCAT44(in_stack_fffffffffffff95c,uVar7),(unsigned_long *)pvVar3);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>
                    *)CONCAT44(in_stack_fffffffffffff95c,uVar7),(char (*) [16])pvVar3);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>
                    *)CONCAT44(in_stack_fffffffffffff95c,uVar7),pvVar3);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
                    *)CONCAT44(in_stack_fffffffffffff95c,uVar7),(char (*) [15])pvVar3);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>
                    *)CONCAT44(in_stack_fffffffffffff95c,uVar7),pvVar3);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (local_4e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx"
                   ,0x58);
        __y_00 = (quaternion<double> *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_370,local_3f8,local_4e8,0x88,1);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
                    *)0x27b609);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>
                    *)0x27b616);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
                    *)0x27b623);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>
                    *)0x27b630);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>
                    *)0x27b63d);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>
                    *)0x27b64a);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>
                    *)0x27b657);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>
                            *)0x27b664);
        boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x27b671);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
  }
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_1e8);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector(this);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector(this);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector(this);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector(this);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector(this);
  return;
}

Assistant:

void hblas3_gemm() {

  size_t NK = N*K;
  size_t KM = K*M;
  size_t NM = N*M;

  size_t LDA = ( _TA == 'N' ) ? N : K;
  size_t LDB = ( _TB == 'N' ) ? K : M;
  size_t LDC = N;

  // Random Quaternion vectors and matricies
  std::vector<_AF> A(NK);
  std::vector<_BF> B(KM);
  std::vector<qd>  C(NM);

  for(auto &x : A) x = genRandom<_AF>();
  for(auto &x : B) x = genRandom<_BF>();
  for(auto &x : C) x = genRandom<qd> ();

  std::vector<qd> CC(C);
  std::vector<qd> SCR(N);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA  = genRandom<_BetaF>();


  std::string AFstr     = t_str<_AF>(); 
  std::string BFstr     = t_str<_BF>(); 
  std::string AlphaFstr = t_str<_AlphaF>(); 
  std::string BetaFstr  = t_str<_BetaF>(); 
                
                


  std::cout << "\n HBLAS GEMM TEST: \n";
  std::cout << "   - _F =      DOUBLE    \n";
  std::cout << "   - _AF =     " << AFstr << "\n";
  std::cout << "   - _BF =     " << BFstr << "\n";
  std::cout << "   - _AlphaF = " << AlphaFstr << "\n";
  std::cout << "   - _BetaF =  " << BetaFstr << "\n";
  std::cout << "   - _TA =     " << _TA << "\n";
  std::cout << "   - _TB =     " << _TB << "\n";

  std::cout << "\n   PROBLEM DIMENSIONS\n";
  std::cout << "     - N =     " << N << "\n";
  std::cout << "     - M =     " << M << "\n";
  std::cout << "     - K =     " << K << "\n";
  std::cout << "     - LDA =   " << LDA << "\n";
  std::cout << "     - LDB =   " << LDB << "\n";
  std::cout << "     - LDC =   " << LDC << "\n";



  std::cout << "\n";



  auto gemmStart = std::chrono::high_resolution_clock::now();

  HBLAS_GEMM(_TA, _TB, N, M, K, ALPHA, &A[0], LDA, &B[0], LDB, BETA, 
    &C[0], LDC);

  auto gemmEnd = std::chrono::high_resolution_clock::now();

  std::chrono::duration<double> gemmDur = gemmEnd - gemmStart;
  std::cout << std::endl << " * GEMM took " << gemmDur.count() 
    << " s\n\n";


  HAXX_INT BStride = 1;
  if( _TB != 'N' ) BStride = LDB;
  if( _TB == 'C' ) 
    for(auto &x : B) x = HAXX::conj(x); 

  for(size_t j = 0; j < M; j++) {

    HAXX_INT BStart = j;
    if( _TB == 'N' ) BStart *= LDB;

    HBLAS_GEMV(_TA, N, K, ALPHA, &A[0], LDA, &B[BStart], BStride, 0., 
      &SCR[0], 1);

    for(size_t i = 0; i < N; i++) {

      size_t indx = RANK2_INDX(i,j,LDC);
      auto refVal = SCR[i] + BETA*CC[indx];
      auto tstVal = C[indx];

      BOOST_CHECK_MESSAGE( 
        CMP_Q( refVal, tstVal ),
        "\n i = " << i << 
          " j = " << j << 
          ", HBLAS_GEMM = " << tstVal << 
          ", REFERENCE = "  << refVal 
      );
    }
  }

}